

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::add_suggest_piece(torrent *this,piece_index_t index)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  unique_lock<std::mutex> local_38;
  
  need_picker(this);
  iVar1 = (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              .
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_torrent_hot_members).m_connections.
                             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             .
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) -
          (int)((ulong)((long)(this->m_peers_to_disconnect).
                              super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_peers_to_disconnect).
                             super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  iVar2 = piece_picker::get_availability
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     index);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_38._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar1) + 0x438);
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 0x2b0);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  suggest_piece::add_piece(&this->m_suggest_pieces,index,(iVar2 * 100) / iVar3,iVar1);
  return;
}

Assistant:

void torrent::add_suggest_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(settings().get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache);

		// when we care about suggest mode, we keep the piece picker
		// around to track piece availability
		need_picker();
		int const peers = std::max(num_peers(), 1);
		int const availability = m_picker->get_availability(index) * 100 / peers;

		m_suggest_pieces.add_piece(index, availability
			, settings().get_int(settings_pack::max_suggest_pieces));
	}